

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ArrayPtr<const_unsigned_char> __thiscall
kj::anon_unknown_36::WebSocketImpl::Header::compose
          (Header *this,bool fin,bool compressed,byte opcode,uint64_t payloadLen,Mask mask)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte in_CH;
  undefined2 in_register_0000000a;
  uint in_register_0000000c;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  bool bVar8;
  ArrayPtr<const_unsigned_char> AVar9;
  
  cVar2 = (char)(payloadLen >> 8);
  cVar4 = (char)(payloadLen >> 0x10);
  cVar3 = (char)(payloadLen >> 0x18);
  this->bytes[0] = fin << 6 | compressed | 0x80;
  cVar1 = (char)payloadLen;
  if (CONCAT44(in_register_0000000c,CONCAT22(in_register_0000000a,CONCAT11(in_CH,opcode))) < 0x7e) {
    this->bytes[1] =
         ((cVar2 != '\0' || cVar1 != '\0') || (cVar3 != '\0' || cVar4 != '\0')) << 7 | opcode;
    sVar6 = 6;
    sVar5 = 2;
    if ((cVar2 == '\0' && cVar1 == '\0') && (cVar3 == '\0' && cVar4 == '\0')) goto LAB_00417ba8;
  }
  else if (CONCAT44(in_register_0000000c,CONCAT22(in_register_0000000a,CONCAT11(in_CH,opcode))) <
           0x10000) {
    sVar6 = 8;
    sVar5 = 4;
    bVar8 = (cVar2 == '\0' && cVar1 == '\0') && (cVar3 == '\0' && cVar4 == '\0');
    bVar7 = 0xfe;
    if (bVar8) {
      bVar7 = '~';
    }
    this->bytes[1] = bVar7;
    this->bytes[2] = in_CH;
    this->bytes[3] = opcode;
    if (bVar8) goto LAB_00417ba8;
  }
  else {
    this->bytes[1] =
         ((cVar2 != '\0' || cVar1 != '\0') || (cVar3 != '\0' || cVar4 != '\0')) << 7 | 0x7f;
    this->bytes[2] = (byte)(in_register_0000000c >> 0x18);
    this->bytes[3] = (byte)(in_register_0000000c >> 0x10);
    this->bytes[4] = (byte)(in_register_0000000c >> 8);
    this->bytes[5] = (byte)(in_register_0000000c >> 10);
    this->bytes[6] = (byte)((ushort)in_register_0000000a >> 8);
    this->bytes[7] = (byte)in_register_0000000a;
    this->bytes[8] = in_CH;
    this->bytes[9] = opcode;
    sVar6 = 0xe;
    sVar5 = 10;
    if ((cVar2 == '\0' && cVar1 == '\0') && (cVar3 == '\0' && cVar4 == '\0')) goto LAB_00417ba8;
  }
  *(int *)(this->bytes + sVar5) = (int)payloadLen;
  sVar5 = sVar6;
LAB_00417ba8:
  AVar9.size_ = sVar5;
  AVar9.ptr = this->bytes;
  return AVar9;
}

Assistant:

kj::ArrayPtr<const byte> compose(bool fin, bool compressed, byte opcode, uint64_t payloadLen,
        Mask mask) {
      bytes[0] = (fin ? FIN_MASK : 0) | (compressed ? RSV1_MASK : 0) | opcode;
      // Note that we can only set the compressed bit on DATA frames.
      bool hasMask = !mask.isZero();

      size_t fill;

      if (payloadLen < 126) {
        bytes[1] = (hasMask ? USE_MASK_MASK : 0) | payloadLen;
        if (hasMask) {
          mask.copyTo(bytes + 2);
          fill = 6;
        } else {
          fill = 2;
        }
      } else if (payloadLen < 65536) {
        bytes[1] = (hasMask ? USE_MASK_MASK : 0) | 126;
        bytes[2] = static_cast<byte>(payloadLen >> 8);
        bytes[3] = static_cast<byte>(payloadLen     );
        if (hasMask) {
          mask.copyTo(bytes + 4);
          fill = 8;
        } else {
          fill = 4;
        }
      } else {
        bytes[1] = (hasMask ? USE_MASK_MASK : 0) | 127;
        bytes[2] = static_cast<byte>(payloadLen >> 56);
        bytes[3] = static_cast<byte>(payloadLen >> 48);
        bytes[4] = static_cast<byte>(payloadLen >> 40);
        bytes[5] = static_cast<byte>(payloadLen >> 42);
        bytes[6] = static_cast<byte>(payloadLen >> 24);
        bytes[7] = static_cast<byte>(payloadLen >> 16);
        bytes[8] = static_cast<byte>(payloadLen >>  8);
        bytes[9] = static_cast<byte>(payloadLen      );
        if (hasMask) {
          mask.copyTo(bytes + 10);
          fill = 14;
        } else {
          fill = 10;
        }
      }

      return arrayPtr(bytes, fill);
    }